

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::SetProperty(cmSourceFile *this,string *prop,char *value)

{
  __type _Var1;
  bool bVar2;
  char *value_local;
  string *prop_local;
  cmSourceFile *this_local;
  
  cmPropertyMap::SetProperty(&this->Properties,prop,value);
  _Var1 = std::operator==(prop,&propGENERATED_abi_cxx11_);
  if (_Var1) {
    bVar2 = cmSystemTools::IsOn(value);
    this->IsGenerated = bVar2;
  }
  return;
}

Assistant:

void cmSourceFile::SetProperty(const std::string& prop, const char* value)
{
  this->Properties.SetProperty(prop, value);

  // Update IsGenerated flag
  if (prop == propGENERATED) {
    this->IsGenerated = cmSystemTools::IsOn(value);
  }
}